

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Declarations.h
# Opt level: O2

void __thiscall
psy::C::AbstractDeclaratorSyntax::~AbstractDeclaratorSyntax(AbstractDeclaratorSyntax *this)

{
  C::SyntaxNode::~SyntaxNode((SyntaxNode *)this);
  Managed::operator_delete(this);
  return;
}

Assistant:

class PSY_C_API AbstractDeclaratorSyntax final : public DeclaratorSyntax
{
    AST_NODE_1K(AbstractDeclarator, Declarator)

public:
    const SpecifierListSyntax* attributes() const { return attrs_; }

private:
    SpecifierListSyntax* attrs_ = nullptr;
    AST_CHILD_LST1(attrs_);
}